

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribIntCase::test
          (CurrentVertexAttribIntCase *this)

{
  int x_00;
  int y_00;
  int z_00;
  int w_00;
  GLint w;
  GLint z;
  GLint y;
  GLint x;
  int index;
  GLint local_24;
  undefined1 local_20 [4];
  int attribute_count;
  Random rnd;
  CurrentVertexAttribIntCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  local_24 = 0x10;
  glu::CallLogWrapper::glGetIntegerv(&(this->super_ApiCase).super_CallLogWrapper,0x8869,&local_24);
  for (y = 0; y < local_24; y = y + 1) {
    x_00 = de::Random::getInt((Random *)local_20,-64000,64000);
    y_00 = de::Random::getInt((Random *)local_20,-64000,64000);
    z_00 = de::Random::getInt((Random *)local_20,-64000,64000);
    w_00 = de::Random::getInt((Random *)local_20,-64000,64000);
    glu::CallLogWrapper::glVertexAttribI4i
              (&(this->super_ApiCase).super_CallLogWrapper,y,x_00,y_00,z_00,w_00);
    verifyCurrentVertexAttribIi
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,y,x_00,y_00,z_00,w_00);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLint x = rnd.getInt(-64000, 64000);
			const GLint y = rnd.getInt(-64000, 64000);
			const GLint z = rnd.getInt(-64000, 64000);
			const GLint w = rnd.getInt(-64000, 64000);

			glVertexAttribI4i(index, x, y, z, w);
			verifyCurrentVertexAttribIi(m_testCtx, *this, index, x, y, z, w);
		}
	}